

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<1>::InnerLeaf<2>
          (InnerLeaf<1> *this,InnerLeaf<2> *other)

{
  const_iterator __n;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *__x;
  iterator __first;
  uint64_t *in_RSI;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffe0;
  
  Occupation::Occupation((Occupation *)in_RDI);
  *(uint64_t *)in_RDI = *in_RSI;
  *(int *)&(in_RDI->value_).coef = (int)in_RSI[1];
  __n = std::array<unsigned_long,_23UL>::cbegin((array<unsigned_long,_23UL> *)0x5ff536);
  std::array<unsigned_long,_23UL>::cbegin((array<unsigned_long,_23UL> *)0x5ff548);
  __x = (HighsHashTableEntry<int,_HighsImplications::VarBound> *)
        std::next<unsigned_long_const*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<unsigned_long,_7UL>::begin((array<unsigned_long,_7UL> *)0x5ff571);
  std::copy<unsigned_long_const*,unsigned_long*>
            (in_stack_ffffffffffffffe0,(unsigned_long *)in_RDI,(unsigned_long *)__x);
  __first = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
                      ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)
                       0x5ff593);
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)0x5ff5a9);
  std::next<HighsHashTableEntry<int,HighsImplications::VarBound>*>(__x,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_6UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_6UL> *)0x5ff5cd);
  std::
  move<HighsHashTableEntry<int,HighsImplications::VarBound>*,HighsHashTableEntry<int,HighsImplications::VarBound>*>
            (__first,in_RDI,__x);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }